

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O1

void ddb_ex(long ndims,Integer *ardims,long npes,double threshold,Integer *blk,Integer *pedims)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *__ptr;
  long lVar5;
  undefined8 *__src;
  long *__ptr_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  int iVar16;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar18 [16];
  int iVar19;
  
  if (ndims == 1) {
    *pedims = npes;
    lVar5 = 1;
    if (1 < *ardims / npes) {
      lVar5 = *ardims / npes;
    }
    *blk = lVar5;
  }
  else {
    __ptr = calloc(ndims,8);
    if (__ptr == (void *)0x0) {
      ddb_ex_cold_3();
    }
    else {
      if (0 < ndims) {
        lVar5 = 0;
        do {
          if (blk[lVar5] < 1) {
            blk[lVar5] = 1;
          }
          lVar5 = lVar5 + 1;
        } while (ndims != lVar5);
      }
      if (0 < ndims) {
        lVar5 = 0;
        do {
          *(long *)((long)__ptr + lVar5 * 8) = ardims[lVar5] / blk[lVar5];
          lVar5 = lVar5 + 1;
        } while (ndims != lVar5);
      }
      if (0 < ndims) {
        lVar5 = 0;
        do {
          if (*(long *)((long)__ptr + lVar5 * 8) < 1) {
            *(undefined8 *)((long)__ptr + lVar5 * 8) = 1;
            blk[lVar5] = ardims[lVar5];
          }
          lVar5 = lVar5 + 1;
        } while (ndims != lVar5);
      }
      __src = (undefined8 *)calloc(ndims,8);
      if (__src == (undefined8 *)0x0) {
        ddb_ex_cold_2();
      }
      else {
        __ptr_00 = (long *)calloc(ndims,8);
        if (__ptr_00 != (long *)0x0) {
          lVar5 = 1;
          if (0 < ndims) {
            lVar6 = 0;
            do {
              lVar5 = lVar5 * *(long *)((long)__ptr + lVar6 * 8);
              lVar6 = lVar6 + 1;
            } while (ndims != lVar6);
          }
          *pedims = npes;
          auVar4 = _DAT_001b4e10;
          auVar3 = _DAT_001b4df0;
          if (1 < ndims) {
            lVar6 = ndims + -2;
            auVar15._8_4_ = (int)lVar6;
            auVar15._0_8_ = lVar6;
            auVar15._12_4_ = (int)((ulong)lVar6 >> 0x20);
            uVar7 = 0;
            auVar15 = auVar15 ^ _DAT_001b4df0;
            do {
              auVar18._8_4_ = (int)uVar7;
              auVar18._0_8_ = uVar7;
              auVar18._12_4_ = (int)(uVar7 >> 0x20);
              auVar18 = (auVar18 | auVar4) ^ auVar3;
              bVar13 = auVar15._0_4_ < auVar18._0_4_;
              iVar16 = auVar15._4_4_;
              iVar19 = auVar18._4_4_;
              if ((bool)(~(iVar16 < iVar19 || iVar19 == iVar16 && bVar13) & 1)) {
                pedims[uVar7 + 1] = 1;
              }
              if (iVar16 >= iVar19 && (iVar19 != iVar16 || !bVar13)) {
                pedims[uVar7 + 2] = 1;
              }
              uVar7 = uVar7 + 2;
            } while ((ndims & 0x7ffffffffffffffeU) != uVar7);
          }
          *__src = 0;
          *__ptr_00 = npes;
          lVar6 = 1;
          if (1 < ndims) {
            lVar6 = ndims;
          }
          dVar14 = -1.0;
          lVar12 = 0;
          bVar13 = false;
          do {
            if (lVar12 == ndims + -1) {
              __src[lVar12] = __ptr_00[lVar12];
              dVar17 = 1.0;
              if (0 < ndims) {
                lVar9 = 0;
                dVar17 = 1.0;
                do {
                  lVar8 = *(long *)((long)__ptr + lVar9 * 8);
                  dVar17 = dVar17 * ((double)(lVar8 - lVar8 % (long)__src[lVar9]) / (double)lVar8);
                  lVar9 = lVar9 + 1;
                } while (ndims != lVar9);
              }
              lVar9 = 0;
              if (0 < ndims) {
                lVar8 = 0;
                do {
                  lVar10 = 1;
                  lVar11 = 0;
                  do {
                    if (lVar8 != lVar11) {
                      lVar10 = lVar10 * (*(long *)((long)__ptr + lVar11 * 8) / (long)__src[lVar11]);
                    }
                    lVar11 = lVar11 + 1;
                  } while (ndims != lVar11);
                  lVar9 = lVar9 + lVar10;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != ndims);
              }
              if (dVar17 <= dVar14) {
                bVar2 = dVar17 == dVar14;
                bVar1 = lVar9 < lVar5;
                if (bVar1 && bVar2) {
                  lVar5 = lVar9;
                  dVar14 = dVar17;
                }
                if ((bVar1 && bVar2) && 0 < ndims) goto LAB_0019b1ab;
              }
              else {
                lVar5 = lVar9;
                dVar14 = dVar17;
                if (0 < ndims) {
LAB_0019b1ab:
                  memcpy(pedims,__src,lVar6 << 3);
                  lVar5 = lVar9;
                  dVar14 = dVar17;
                }
              }
              if (threshold < dVar14) break;
LAB_0019b1f3:
              __src[lVar12] = 0;
              lVar12 = lVar12 + -1;
            }
            else {
              lVar9 = __src[lVar12];
              if (lVar9 == __ptr_00[lVar12]) {
                bVar13 = lVar12 == 0;
                goto LAB_0019b1f3;
              }
              do {
                lVar9 = lVar9 + 1;
              } while (__ptr_00[lVar12] % lVar9 != 0);
              __src[lVar12] = lVar9;
              __ptr_00[lVar12 + 1] = npes;
              if (-1 < lVar12) {
                lVar9 = __ptr_00[lVar12 + 1];
                lVar8 = 0;
                do {
                  lVar9 = lVar9 / (long)__src[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar12 + 1 != lVar8);
                __ptr_00[lVar12 + 1] = lVar9;
              }
              __src[lVar12 + 1] = 0;
              lVar12 = lVar12 + 1;
            }
          } while (!bVar13);
          if (0 < ndims) {
            lVar5 = 0;
            do {
              lVar6 = ardims[lVar5] / pedims[lVar5];
              if (lVar6 < 2) {
                lVar6 = 1;
              }
              blk[lVar5] = lVar6;
              lVar5 = lVar5 + 1;
            } while (ndims != lVar5);
          }
          free(__ptr);
          free(__ptr_00);
          free(__src);
          return;
        }
        ddb_ex_cold_1();
      }
    }
  }
  return;
}

Assistant:

void ddb_ex( long ndims, Integer ardims[], long npes, double threshold,
             Integer blk[], Integer pedims[])
{
      Integer *tdims;
      long *pdivs;
      long npdivs;
      long i, j, k;
      long bev;
      long pc, done;
      long *stack;
      Integer *tard;
      long r, cev;
      double clb, blb;

      /*- Quick exit -*/
      if(ndims==1) {
           pedims[0] = npes;
           blb = dd_ev(ndims,ardims,pedims);
           dd_su(1,ardims,pedims,blk);
           return;
      }

      /*- Reset array dimensions to reflect granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;
      for(i=0;i<ndims;i++) tard[i] = ardims[i] / blk[i];
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i]; }

      /*- Allocate memory for current solution -*/
      tdims = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tdims==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }

      /*- Allocate memory to hold divisors of npes -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      /*- Allocate storage for the recursion stack -*/
      stack = (long *) calloc((size_t)ndims,sizeof(long));
      if(stack==NULL){
         fprintf(stderr,"%s: %s\n","ddb_ex",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         free(pdivs);
         return;
      }

      /*- Find all divisors of npes -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;

      /*- Pump priming the exhaustive search -*/
      blb = -1.0;
      bev = 1.0;
      for(i=0;i<ndims;i++) bev *= tard[i];
      pedims[0]=npes; for(i=1;i<ndims;i++) pedims[i] = 1;
      tdims[0] = 0;
      stack[0] = npes;
      pc = 0;
      done = 0;

      /*-  Recursion loop -*/
      do {
         if(pc==ndims-1) {
	   /*- Set the number of processes for the last dimension -*/
           tdims[pc] = stack[pc];

	   /*- Evaluate current solution  -*/
            clb = dd_ev(ndims,tard,tdims);
            cev = 0;
            for(k=0; k<ndims; k++){
               r = 1;
               for(j=0; j<ndims; j++) {
                  if(j!=k) r = r*(tard[j]/tdims[j]);
               }
               cev = cev+r;
            }
            if(clb>blb || (clb==blb && cev<bev)) {
               for(j=0; j<ndims; j++) pedims[j] = tdims[j];
               blb = clb;
               bev = cev;
            }
            if(blb>threshold) break;
            tdims[pc] = 0;
            pc -= 1;
         } else {
           if( tdims[pc] == stack[pc] ) {
	     /*- Backtrack when current array dimension has exhausted 
              *- all remaining processes
              */
              done = (pc==0);
              tdims[pc] = 0;
              pc -= 1;
           } else {
	     /*- Increment the number of processes assigned to the current
              *- array axis.
              */
              for(tdims[pc]+=1; stack[pc]%tdims[pc]!=0; tdims[pc]+=1);
              pc += 1;
              stack[pc] = npes;
              for(i=0;i<pc;i++) stack[pc] /= tdims[i];
              tdims[pc] = 0;
           }
         }
      } while(!done);

      dd_su(ndims,ardims,pedims,blk);

      free(tard);
      free(stack);
      free(tdims);
      free(pdivs);
}